

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS ref_part_cad_association(REF_GRID ref_grid,char *filename)

{
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  int iVar1;
  uint uVar2;
  REF_STATUS RVar3;
  size_t sVar4;
  FILE *__stream;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  REF_BOOL available;
  REF_INT version;
  REF_FILEPOS next_position;
  REF_LONG ngeom;
  REF_INT dim;
  REF_FILEPOS key_pos [156];
  int local_540;
  REF_INT local_53c;
  FILE *local_538;
  size_t local_530;
  REF_LONG local_528;
  undefined1 local_51c [4];
  REF_FILEPOS local_518 [157];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  ref_geom = ref_grid->geom;
  local_530 = 0xffffffffffffffff;
  sVar4 = strlen(filename);
  iVar1 = strcmp(filename + (sVar4 - 6),".meshb");
  if (iVar1 != 0) {
    pcVar7 = "expected .meshb extension";
    uVar2 = 3;
    uVar5 = 0x3b3;
    uVar6 = 3;
    goto LAB_001bd1e2;
  }
  if (ref_mpi->id == 0) {
    uVar2 = ref_import_meshb_header(filename,&local_53c,local_518);
    if (uVar2 == 0) {
      __stream = fopen(filename,"r");
      if (__stream == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x3bc,"ref_part_cad_association","unable to open file");
        return 2;
      }
      uVar2 = ref_import_meshb_jump
                        ((FILE *)__stream,local_53c,local_518,3,&local_540,(REF_FILEPOS *)&local_530
                        );
      if (uVar2 == 0) {
        if (local_540 == 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x3c0,"ref_part_cad_association","meshb missing dimension");
          return 1;
        }
        sVar4 = fread(local_51c,4,1,__stream);
        if (sVar4 != 1) {
          pcVar7 = "dim";
          sVar8 = 1;
          uVar5 = 0x3c1;
LAB_001bd253:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar5,"ref_part_cad_association",pcVar7,sVar8,sVar4);
          return 1;
        }
        goto LAB_001bce4d;
      }
      pcVar7 = "jump";
      uVar5 = 0x3bf;
    }
    else {
      pcVar7 = "header";
      uVar5 = 0x3b7;
    }
  }
  else {
    __stream = (FILE *)0x0;
LAB_001bce4d:
    uVar2 = ref_mpi_bcast(ref_mpi,&local_53c,1,1);
    if (uVar2 == 0) {
      uVar2 = ref_geom_initialize(ref_geom);
      if (uVar2 == 0) {
        iVar1 = 0;
        local_538 = __stream;
        do {
          if (ref_grid->mpi->id == 0) {
            uVar2 = ref_import_meshb_jump
                              ((FILE *)local_538,local_53c,local_518,iVar1 + 0x28,&local_540,
                               (REF_FILEPOS *)&local_530);
            if (uVar2 != 0) {
              pcVar7 = "jump";
              uVar5 = 0x3cd;
              goto LAB_001bd1df;
            }
            if ((local_540 != 0) &&
               (RVar3 = ref_part_meshb_long((FILE *)local_538,local_53c,&local_528), RVar3 != 0)) {
              pcVar7 = "ngeom";
              uVar2 = 1;
              uVar5 = 0x3cf;
              uVar6 = 1;
              goto LAB_001bd1e2;
            }
          }
          uVar2 = ref_mpi_bcast(ref_mpi,&local_540,1,1);
          if (uVar2 != 0) {
            pcVar7 = "bcast";
            uVar5 = 0x3d3;
            goto LAB_001bd1df;
          }
          if (local_540 != 0) {
            uVar2 = ref_mpi_bcast(ref_mpi,&local_528,1,2);
            if (uVar2 != 0) {
              pcVar7 = "bcast";
              uVar5 = 0x3d5;
              goto LAB_001bd1df;
            }
            uVar2 = ref_part_meshb_geom_bcast
                              (ref_geom,local_528,iVar1,ref_node,local_53c,(FILE *)local_538);
            sVar8 = local_530;
            if (uVar2 != 0) {
              pcVar7 = "part geom bcast";
              uVar5 = 0x3d8;
              goto LAB_001bd1df;
            }
            if ((ref_grid->mpi->id == 0) && (sVar4 = ftello(local_538), sVar8 != sVar4)) {
              pcVar7 = "end location";
              uVar5 = 0x3da;
              goto LAB_001bd253;
            }
          }
          iVar1 = iVar1 + 1;
          if (iVar1 == 3) {
            if (ref_grid->mpi->id == 0) {
              fclose(local_538);
              return 0;
            }
            return 0;
          }
        } while( true );
      }
      pcVar7 = "clear out previous assoc";
      uVar5 = 0x3c6;
    }
    else {
      pcVar7 = "bcast";
      uVar5 = 0x3c4;
    }
  }
LAB_001bd1df:
  uVar6 = (ulong)uVar2;
LAB_001bd1e2:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar5,
         "ref_part_cad_association",uVar6,pcVar7);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_association(REF_GRID ref_grid,
                                            const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT type, geom_keyword;
  REF_LONG ngeom;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }
  RSS(ref_mpi_bcast(ref_mpi, &version, 1, REF_INT_TYPE), "bcast");

  RSS(ref_geom_initialize(ref_geom), "clear out previous assoc");

  each_ref_type(ref_geom, type) {
    if (ref_grid_once(ref_grid)) {
      geom_keyword = 40 + type;
      RSS(ref_import_meshb_jump(file, version, key_pos, geom_keyword,
                                &available, &next_position),
          "jump");
      if (available) {
        RSS(ref_part_meshb_long(file, version, &ngeom), "ngeom");
        if (verbose) printf("type %d ngeom %ld\n", type, ngeom);
      }
    }
    RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");
    if (available) {
      RSS(ref_mpi_bcast(ref_mpi, &ngeom, 1, REF_LONG_TYPE), "bcast");
      RSS(ref_part_meshb_geom_bcast(ref_geom, ngeom, type, ref_node, version,
                                    file),
          "part geom bcast");
      if (ref_grid_once(ref_grid))
        REIS(next_position, ftello(file), "end location");
    }
  }

  if (ref_grid_once(ref_grid)) {
    fclose(file);
  }

  return REF_SUCCESS;
}